

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeCommLink.cpp
# Opt level: O1

char * xe::getCommLinkStateName(CommLinkState state)

{
  if (state < COMMLINKSTATE_LAST) {
    return &DAT_00141588 + *(int *)(&DAT_00141588 + (ulong)state * 4);
  }
  return (char *)0x0;
}

Assistant:

const char* getCommLinkStateName (CommLinkState state)
{
	switch (state)
	{
		case COMMLINKSTATE_READY:						return "COMMLINKSTATE_READY";
		case COMMLINKSTATE_TEST_PROCESS_LAUNCHING:		return "COMMLINKSTATE_PROCESS_LAUNCHING";
		case COMMLINKSTATE_TEST_PROCESS_RUNNING:		return "COMMLINKSTATE_PROCESS_RUNNING";
		case COMMLINKSTATE_TEST_PROCESS_FINISHED:		return "COMMLINKSTATE_FINISHED";
		case COMMLINKSTATE_TEST_PROCESS_LAUNCH_FAILED:	return "COMMLINKSTATE_LAUNCH_FAILED";
		case COMMLINKSTATE_ERROR:						return "COMMLINKSTATE_ERROR";
		default:
			DE_ASSERT(false);
			return DE_NULL;
	}
}